

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void __thiscall
google::protobuf::SplitStringAllowEmpty
          (protobuf *this,StringPiece full,char *delim,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  stringpiece_ssize_type sVar1;
  size_type pos;
  StringPiece local_80;
  StringPiece local_70;
  string local_60;
  StringPiece local_40;
  
  local_40.length_ = (stringpiece_ssize_type)full.ptr_;
  pos = 0;
  local_40.ptr_ = (char *)this;
  while( true ) {
    StringPiece::StringPiece(&local_70,(char *)full.length_);
    sVar1 = StringPiece::find_first_of(&local_40,local_70,pos);
    if (sVar1 == -1) break;
    local_80 = StringPiece::substr(&local_40,pos,sVar1 - pos);
    StringPiece::ToString_abi_cxx11_(&local_60,&local_80);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,&local_60)
    ;
    std::__cxx11::string::~string((string *)&local_60);
    pos = sVar1 + 1;
  }
  local_80 = StringPiece::substr(&local_40,pos,0xffffffffffffffff);
  StringPiece::ToString_abi_cxx11_(&local_60,&local_80);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)delim,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void SplitStringAllowEmpty(StringPiece full, const char *delim,
                           std::vector<std::string> *result) {
  std::back_insert_iterator<std::vector<std::string> > it(*result);
  SplitStringToIteratorAllowEmpty(full, delim, 0, it);
}